

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::SourceCodeInfo::SourceCodeInfo(SourceCodeInfo *this)

{
  SourceCodeInfo *pSVar1;
  SourceCodeInfo *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SourceCodeInfo_00d612b0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,4);
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::RepeatedPtrField(&this->location_);
  pSVar1 = internal_default_instance();
  if (this != pSVar1) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

SourceCodeInfo::SourceCodeInfo()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.SourceCodeInfo)
}